

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFont::AddGlyph(ImFont *this,ImWchar codepoint,float x0,float y0,float x1,float y1,float u0,
                float v0,float u1,float v1,float advance_x)

{
  int iVar1;
  ImFontGlyph *__src;
  ImFontConfig *pIVar2;
  ImFontGlyph *__dest;
  int iVar3;
  int iVar4;
  float fVar5;
  
  iVar1 = (this->Glyphs).Size;
  iVar4 = iVar1 + 1;
  iVar3 = (this->Glyphs).Capacity;
  if (iVar1 < iVar3) {
    __dest = (this->Glyphs).Data;
  }
  else {
    if (iVar3 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar3 / 2 + iVar3;
    }
    if (iVar3 <= iVar4) {
      iVar3 = iVar4;
    }
    __dest = (ImFontGlyph *)ImGui::MemAlloc((long)iVar3 * 0x28);
    __src = (this->Glyphs).Data;
    if (__src != (ImFontGlyph *)0x0) {
      memcpy(__dest,__src,(long)(this->Glyphs).Size * 0x28);
      ImGui::MemFree((this->Glyphs).Data);
    }
    (this->Glyphs).Data = __dest;
    (this->Glyphs).Capacity = iVar3;
  }
  (this->Glyphs).Size = iVar4;
  __dest[iVar1].Codepoint = codepoint;
  __dest[iVar1].X0 = x0;
  __dest[iVar1].Y0 = y0;
  __dest[iVar1].X1 = x1;
  __dest[iVar1].Y1 = y1;
  __dest[iVar1].U0 = u0;
  __dest[iVar1].V0 = v0;
  __dest[iVar1].U1 = u1;
  __dest[iVar1].V1 = v1;
  pIVar2 = this->ConfigData;
  fVar5 = advance_x + (pIVar2->GlyphExtraSpacing).x;
  __dest[iVar1].AdvanceX = fVar5;
  if (pIVar2->PixelSnapH == true) {
    __dest[iVar1].AdvanceX = (float)(int)(fVar5 + 0.5);
  }
  this->DirtyLookupTables = true;
  this->MetricsTotalSurface =
       this->MetricsTotalSurface +
       (int)((float)this->ContainerAtlas->TexHeight * (v1 - v0) + 1.99) *
       (int)((float)this->ContainerAtlas->TexWidth * (u1 - u0) + 1.99);
  return;
}

Assistant:

void ImFont::AddGlyph(ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (ImWchar)codepoint;
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x + ConfigData->GlyphExtraSpacing.x;  // Bake spacing into AdvanceX

    if (ConfigData->PixelSnapH)
        glyph.AdvanceX = (float)(int)(glyph.AdvanceX + 0.5f);

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + 1.99f) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + 1.99f);
}